

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

bool filemgr_is_fully_resident(filemgr *file)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  long in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double num_fblocks;
  uint64_t num_blocks;
  double num_cached_blocks;
  bool ret;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar7;
  bool local_9;
  
  local_9 = false;
  if (0 < global_config.ncacheblock) {
    uVar1 = bcache_get_num_blocks
                      ((filemgr *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    uVar6 = 0x43300000;
    uVar7 = 0x45300000;
    auVar4._8_4_ = (int)(uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = 0x45300000;
    uVar2 = atomic_get_uint64_t((atomic<unsigned_long> *)0x0,0x45300000);
    uVar3 = uVar2 / *(uint *)(in_RDI + 0x10);
    auVar5._8_4_ = (int)(uVar3 >> 0x20);
    auVar5._0_8_ = uVar3;
    auVar5._12_4_ = uVar7;
    local_9 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(uVar6,(int)uVar3) - 4503599627370496.0)) * 0.9 <
              (auVar4._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  }
  return local_9;
}

Assistant:

bool filemgr_is_fully_resident(struct filemgr *file)
{
    bool ret = false;
    if (global_config.ncacheblock > 0) {
        //TODO: A better thing to do is to track number of document blocks
        // and only compare those with the cached document block count
        double num_cached_blocks = (double)bcache_get_num_blocks(file);
        uint64_t num_blocks = atomic_get_uint64_t(&file->pos)
                                 / file->blocksize;
        double num_fblocks = (double)num_blocks;
        if (num_cached_blocks > num_fblocks * FILEMGR_RESIDENT_THRESHOLD) {
            ret = true;
        }
    }
    return ret;
}